

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

void Cba_NtkAddMissingFonNames(Cba_Ntk_t *p,char *pPref)

{
  Cba_Man_t *pCVar1;
  int iVar2;
  int iVar3;
  int i;
  int iVar4;
  uint i_00;
  
  pCVar1 = p->pDesign;
  for (iVar4 = 0; iVar4 < (pCVar1->vUsed).nSize; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(&pCVar1->vUsed,iVar4);
    Vec_IntWriteEntry(&pCVar1->vNameMap,iVar2,0);
  }
  (pCVar1->vUsed).nSize = 0;
  iVar4 = 1;
  while( true ) {
    iVar2 = (p->vFonName).nSize;
    if (iVar2 <= iVar4) break;
    iVar2 = Vec_IntEntry(&p->vFonName,iVar4);
    if (iVar2 != 0) {
      Cba_ManSetMap(p->pDesign,iVar2,iVar4);
    }
    iVar4 = iVar4 + 1;
  }
  for (i_00 = 1; (int)i_00 < iVar2; i_00 = i_00 + 1) {
    iVar4 = Vec_IntEntry(&p->vFonName,i_00);
    if (iVar4 == 0) {
      iVar2 = Cba_NtkNewStrId(p,"%s%d",pPref,(ulong)i_00);
      iVar4 = 1;
      while( true ) {
        iVar3 = Vec_IntGetEntry(&p->pDesign->vNameMap,iVar2);
        if (iVar3 == 0) break;
        iVar2 = Cba_NtkNewStrId(p,"%s%d_%d",pPref,(ulong)i_00,iVar4);
        iVar4 = iVar4 + 1;
      }
      Cba_FonSetName(p,i_00,iVar2);
      Cba_ManSetMap(p->pDesign,iVar2,i_00);
    }
    iVar2 = (p->vFonName).nSize;
  }
  return;
}

Assistant:

static inline void Cba_NtkAddMissingFonNames( Cba_Ntk_t * p, char * pPref )
{
    int iFon, NameId, Index;
    // populate map
    Cba_ManCleanMap( p->pDesign );
    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
        if ( NameId )
            Cba_ManSetMap( p->pDesign, NameId, iFon );
    // check remaining ones
    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
    {
        if ( NameId )
            continue;
        NameId = Cba_NtkNewStrId(p, "%s%d", pPref, iFon);
        for ( Index = 1; Cba_ManGetMap(p->pDesign, NameId); Index++ )
            NameId = Cba_NtkNewStrId(p, "%s%d_%d", pPref, iFon, Index);
        Cba_FonSetName( p, iFon, NameId );
        Cba_ManSetMap( p->pDesign, NameId, iFon );
    }
}